

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3NotPureFunc(sqlite3_context *pCtx)

{
  char *pcVar1;
  char *z;
  long in_RDI;
  char *zMsg;
  char *zContext;
  VdbeOp *pOp;
  int local_4;
  
  pcVar1 = (char *)(*(long *)(*(long *)(in_RDI + 0x18) + 0x88) +
                   (long)*(int *)(in_RDI + 0x20) * 0x18);
  if (*pcVar1 == 'A') {
    if ((*(ushort *)(pcVar1 + 2) & 4) == 0) {
      if ((*(ushort *)(pcVar1 + 2) & 8) == 0) {
        pcVar1 = "an index";
      }
      else {
        pcVar1 = "a generated column";
      }
    }
    else {
      pcVar1 = "a CHECK constraint";
    }
    z = sqlite3_mprintf("non-deterministic use of %s() in %s",
                        *(undefined8 *)(*(long *)(in_RDI + 8) + 0x38),pcVar1);
    sqlite3_result_error((sqlite3_context *)pcVar1,z,0);
    sqlite3_free((void *)0x22cd77);
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3NotPureFunc(sqlite3_context *pCtx){
  const VdbeOp *pOp;
#ifdef SQLITE_ENABLE_STAT4
  if( pCtx->pVdbe==0 ) return 1;
#endif
  pOp = pCtx->pVdbe->aOp + pCtx->iOp;
  if( pOp->opcode==OP_PureFunc ){
    const char *zContext;
    char *zMsg;
    if( pOp->p5 & NC_IsCheck ){
      zContext = "a CHECK constraint";
    }else if( pOp->p5 & NC_GenCol ){
      zContext = "a generated column";
    }else{
      zContext = "an index";
    }
    zMsg = sqlite3_mprintf("non-deterministic use of %s() in %s",
                           pCtx->pFunc->zName, zContext);
    sqlite3_result_error(pCtx, zMsg, -1);
    sqlite3_free(zMsg);
    return 0;
  }
  return 1;
}